

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O3

__pid_t __thiscall PixelToaster::UnixTimer::wait(UnixTimer *this,void *__stat_loc)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  double in_XMM0_Qa;
  double dVar4;
  timespec timeRemaining;
  timespec local_38;
  timespec local_28;
  
  dVar4 = floor(in_XMM0_Qa);
  local_28.tv_sec = (__time_t)dVar4;
  local_28.tv_nsec = (long)((in_XMM0_Qa - dVar4) * 1000000000.0);
  uVar1 = nanosleep(&local_28,&local_38);
  if (uVar1 == 0xffffffff) {
    piVar2 = __errno_location();
    piVar3 = piVar2;
    do {
      if (*piVar2 != 4) {
        return (__pid_t)piVar3;
      }
      local_28.tv_sec = local_38.tv_sec;
      local_28.tv_nsec = local_38.tv_nsec;
      uVar1 = nanosleep(&local_28,&local_38);
      piVar3 = (int *)(ulong)uVar1;
    } while (uVar1 == 0xffffffff);
  }
  return uVar1;
}

Assistant:

void wait(double seconds)
    {
        internal::wait(seconds);
    }